

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
Importer_isResolvedComponentOverTwoLevelsUnresolved_Test::
~Importer_isResolvedComponentOverTwoLevelsUnresolved_Test
          (Importer_isResolvedComponentOverTwoLevelsUnresolved_Test *this)

{
  Importer_isResolvedComponentOverTwoLevelsUnresolved_Test *this_local;
  
  ~Importer_isResolvedComponentOverTwoLevelsUnresolved_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, isResolvedComponentOverTwoLevelsUnresolved)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/component_importer_unresolved.cellml"));
    auto importer = libcellml::Importer::create();

    EXPECT_TRUE(model->hasUnresolvedImports());
    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(2), importer->libraryCount());

    auto component = model->component(0);

    EXPECT_FALSE(component->isResolved());

    EXPECT_TRUE(model->hasUnresolvedImports());
}